

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

string * __thiscall
deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this,Primitive primitive)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             _ZZN4deqp3gls12DrawTestSpec17primitiveToStringB5cxx11ENS1_9PrimitiveEE10primitives_rel
             + *(int *)(
                       _ZZN4deqp3gls12DrawTestSpec17primitiveToStringB5cxx11ENS1_9PrimitiveEE10primitives_rel
                       + (long)(int)this * 4),&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::primitiveToString (Primitive primitive)
{
	static const char* primitives[] =
	{
		"points",					// PRIMITIVE_POINTS ,
		"triangles",				// PRIMITIVE_TRIANGLES,
		"triangle_fan",				// PRIMITIVE_TRIANGLE_FAN,
		"triangle_strip",			// PRIMITIVE_TRIANGLE_STRIP,
		"lines",					// PRIMITIVE_LINES
		"line_strip",				// PRIMITIVE_LINE_STRIP
		"line_loop",				// PRIMITIVE_LINE_LOOP
		"lines_adjacency",			// PRIMITIVE_LINES_ADJACENCY
		"line_strip_adjacency",		// PRIMITIVE_LINE_STRIP_ADJACENCY
		"triangles_adjacency",		// PRIMITIVE_TRIANGLES_ADJACENCY
		"triangle_strip_adjacency",	// PRIMITIVE_TRIANGLE_STRIP_ADJACENCY
	};

	return de::getSizedArrayElement<DrawTestSpec::PRIMITIVE_LAST>(primitives, (int)primitive);
}